

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O1

int save_image_as_DDS(char *filename,int width,int height,int channels,uchar *data)

{
  int iVar1;
  int iVar2;
  uchar *__ptr;
  FILE *__s;
  undefined8 uStack_b8;
  DDS_header header;
  int DDS_size;
  
  iVar1 = 0;
  iVar2 = 0;
  if ((((data != (uchar *)0x0) && (iVar2 = 0, filename != (char *)0x0)) &&
      (iVar2 = iVar1, 0 < width)) && ((0 < height && (0xfffffffb < channels - 5U)))) {
    if ((channels & 1U) == 0) {
      __ptr = convert_image_to_DXT5(data,width,height,channels,(int *)&header.dwReserved2);
      header.sPixelFormat.dwSize = 0x35545844;
    }
    else {
      __ptr = convert_image_to_DXT1(data,width,height,channels,(int *)&header.dwReserved2);
      header.sPixelFormat.dwSize = 0x31545844;
    }
    header.dwWidth = 0;
    header.dwPitchOrLinearSize = 0;
    header.dwReserved1[6] = 0;
    header.dwReserved1[7] = 0;
    header.sPixelFormat.dwFlags = 0;
    header.sPixelFormat.dwFourCC = 0;
    header.sPixelFormat.dwRGBBitCount = 0;
    header.sPixelFormat.dwRBitMask = 0;
    header.sPixelFormat.dwAlphaBitMask = 0;
    header.sCaps.dwCaps1 = 0;
    header.sCaps.dwCaps2 = 0;
    header.sCaps.dwDDSX = 0;
    header.dwReserved1[2] = 0;
    header.dwReserved1[3] = 0;
    header.dwReserved1[4] = 0;
    header.dwReserved1[5] = 0;
    header.dwDepth = 0;
    header.dwMipMapCount = 0;
    header.dwReserved1[0] = 0;
    header.dwReserved1[1] = 0;
    uStack_b8 = 0x7c20534444;
    header.dwSize = height;
    header.dwMagic = 0x81007;
    header.dwHeight = header.dwReserved2;
    header.dwFlags = width;
    header.dwReserved1[8] = 0;
    header.dwReserved1[9] = 0x20;
    header.dwReserved1[10] = 4;
    header.sPixelFormat.dwGBitMask = 0;
    header.sPixelFormat.dwBBitMask = 0x1000;
    __s = fopen(filename,"wb");
    fwrite(&uStack_b8,0x80,1,__s);
    fwrite(__ptr,1,(long)(int)header.dwReserved2,__s);
    fclose(__s);
    free(__ptr);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
	save_image_as_DDS
	(
		const char *filename,
		int width, int height, int channels,
		const unsigned char *const data
	)
{
	/*	variables	*/
	FILE *fout;
	unsigned char *DDS_data;
	DDS_header header;
	int DDS_size;
	/*	error check	*/
	if( (NULL == filename) ||
		(width < 1) || (height < 1) ||
		(channels < 1) || (channels > 4) ||
		(data == NULL ) )
	{
		return 0;
	}
	/*	Convert the image	*/
	if( (channels & 1) == 1 )
	{
		/*	no alpha, just use DXT1	*/
		DDS_data = convert_image_to_DXT1( data, width, height, channels, &DDS_size );
	} else
	{
		/*	has alpha, so use DXT5	*/
		DDS_data = convert_image_to_DXT5( data, width, height, channels, &DDS_size );
	}
	/*	save it	*/
	memset( &header, 0, sizeof( DDS_header ) );
	header.dwMagic = ('D' << 0) | ('D' << 8) | ('S' << 16) | (' ' << 24);
	header.dwSize = 124;
	header.dwFlags = DDSD_CAPS | DDSD_HEIGHT | DDSD_WIDTH | DDSD_PIXELFORMAT | DDSD_LINEARSIZE;
	header.dwWidth = width;
	header.dwHeight = height;
	header.dwPitchOrLinearSize = DDS_size;
	header.sPixelFormat.dwSize = 32;
	header.sPixelFormat.dwFlags = DDPF_FOURCC;
	if( (channels & 1) == 1 )
	{
		header.sPixelFormat.dwFourCC = ('D' << 0) | ('X' << 8) | ('T' << 16) | ('1' << 24);
	} else
	{
		header.sPixelFormat.dwFourCC = ('D' << 0) | ('X' << 8) | ('T' << 16) | ('5' << 24);
	}
	header.sCaps.dwCaps1 = DDSCAPS_TEXTURE;
	/*	write it out	*/
	fout = fopen( filename, "wb");
	fwrite( &header, sizeof( DDS_header ), 1, fout );
	fwrite( DDS_data, 1, DDS_size, fout );
	fclose( fout );
	/*	done	*/
	free( DDS_data );
	return 1;
}